

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  DefaultFBOMultisampleCase *pDVar2;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "default_framebuffer","Test with default framebuffer");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)node_00,pCVar1->m_testCtx,"sample_position","test SAMPLE_POSITION");
  node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a5bc8;
  tcu::TestNode::addChild(node,node_00);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"sample_mask_sum_of_inverses",
             "Test that mask and its negation\'s sum equal the fully set mask",0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5c18;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xc0);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"proportionality_sample_mask",
             "Test the proportionality property of GL_SAMPLE_MASK",0x20);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5cb8;
  *(undefined8 *)&pDVar2->field_0xb4 = 0xffffffff;
  *(undefined4 *)((long)&pDVar2[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
       = 0xffffffff;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"constancy_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_MASK"
             ,0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5d08;
  *(undefined4 *)&pDVar2->field_0xb1 = 0x1000000;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_MASK"
             ,0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5d08;
  *(undefined4 *)&pDVar2->field_0xb1 = 0x1000001;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK"
             ,0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5d08;
  *(undefined4 *)&pDVar2->field_0xb1 = 0x1000100;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,
             "constancy_alpha_to_coverage_sample_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE, GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK"
             ,0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5d08;
  *(undefined4 *)&pDVar2->field_0xb1 = 0x1000101;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  pDVar2 = (DefaultFBOMultisampleCase *)operator_new(0xb8);
  Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
            (pDVar2,(this->super_TestCaseGroup).m_context,"sample_mask_non_effective_bits",
             "Test that values of unused bits of a sample mask (bit index > sample count) have no effect"
             ,0x100);
  (pDVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_021a5d58;
  tcu::TestNode::addChild(node,(TestNode *)pDVar2);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Test with default framebuffer");

	addChild(group);

	// .default_framebuffer
	{
		// sample positions
		group->addChild(new SamplePosQueryCase			(m_context, "sample_position", "test SAMPLE_POSITION"));

		// sample mask
		group->addChild(new MaskInvertCase				(m_context, "sample_mask_sum_of_inverses",	"Test that mask and its negation's sum equal the fully set mask"));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_mask",	"Test the proportionality property of GL_SAMPLE_MASK"));

		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_ALPHA_TO_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_SAMPLE_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage_sample_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE, GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_ALPHA_TO_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new SampleMaskHighBitsCase		(m_context, "sample_mask_non_effective_bits",
																	"Test that values of unused bits of a sample mask (bit index > sample count) have no effect"));
	}
}